

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O0

bool __thiscall Json::Reader::pushError(Reader *this,Value *value,string *message,Value *extra)

{
  Location pCVar1;
  Location pCVar2;
  long lVar3;
  ptrdiff_t pVar4;
  ptrdiff_t pVar5;
  undefined1 auStack_98 [8];
  ErrorInfo info;
  undefined4 uStack_4c;
  Token token;
  ptrdiff_t length;
  Value *extra_local;
  string *message_local;
  Value *value_local;
  Reader *this_local;
  
  lVar3 = (long)this->end_ - (long)this->begin_;
  pVar4 = Value::getOffsetStart(value);
  if (((pVar4 <= lVar3) && (pVar4 = Value::getOffsetLimit(value), pVar4 <= lVar3)) &&
     (pVar4 = Value::getOffsetLimit(extra), pVar4 <= lVar3)) {
    pCVar1 = this->begin_;
    pVar4 = Value::getOffsetStart(value);
    pCVar2 = this->begin_;
    pVar5 = Value::getOffsetLimit(value);
    ErrorInfo::ErrorInfo((ErrorInfo *)auStack_98);
    auStack_98._4_4_ = uStack_4c;
    auStack_98._0_4_ = tokenError;
    info.token_._0_8_ = pCVar1 + pVar4;
    info.token_.start_ = pCVar2 + pVar5;
    std::__cxx11::string::operator=((string *)&info.token_.end_,(string *)message);
    pCVar1 = this->begin_;
    pVar4 = Value::getOffsetStart(extra);
    info.message_.field_2._8_8_ = pCVar1 + pVar4;
    std::deque<Json::Reader::ErrorInfo,_std::allocator<Json::Reader::ErrorInfo>_>::push_back
              (&this->errors_,(value_type *)auStack_98);
    ErrorInfo::~ErrorInfo((ErrorInfo *)auStack_98);
    return true;
  }
  return false;
}

Assistant:

bool Reader::pushError(const Value& value, const JSONCPP_STRING& message, const Value& extra) {
  ptrdiff_t const length = end_ - begin_;
  if(value.getOffsetStart() > length
    || value.getOffsetLimit() > length
    || extra.getOffsetLimit() > length)
    return false;
  Token token;
  token.type_ = tokenError;
  token.start_ = begin_ + value.getOffsetStart();
  token.end_ = begin_ + value.getOffsetLimit();
  ErrorInfo info;
  info.token_ = token;
  info.message_ = message;
  info.extra_ = begin_ + extra.getOffsetStart();
  errors_.push_back(info);
  return true;
}